

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

void pnga_scale_patch(Integer g_a,Integer *lo,Integer *hi,void *alpha)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  undefined1 auVar4 [16];
  double dVar5;
  int iVar6;
  long lVar7;
  logical lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Integer icode;
  long lVar12;
  undefined1 (*pauVar13) [16];
  long lVar14;
  Integer IVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  char *src_data_ptr;
  undefined8 uStack_550;
  Integer loA [7];
  Integer type;
  Integer ndim;
  Integer hiA [7];
  long local_4b8 [8];
  Integer *local_478;
  Integer *local_470 [9];
  Integer bunit [7];
  Integer ld [7];
  Integer loS [7];
  Integer dims [7];
  _iterator_hdl hdl;
  
  local_478 = lo;
  local_470[0] = hi;
  pnga_nodeid();
  bVar16 = _ga_sync_begin != 0;
  uStack_550._4_4_ = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar16) {
    pnga_sync();
  }
  pnga_inquire(g_a,&type,&ndim,dims);
  pnga_total_blocks(g_a);
  pnga_local_iterator_init(g_a,&hdl);
  lVar3 = 1;
  do {
    do {
      iVar6 = pnga_local_iterator_next(&hdl,loA,hiA,&src_data_ptr,ld);
      IVar15 = ndim;
      if (iVar6 == 0) {
        if (uStack_550._4_4_ != 0) {
          pnga_sync();
        }
        return;
      }
      lVar10 = 0;
      if (0 < ndim) {
        lVar10 = ndim;
      }
      for (lVar7 = 0; lVar10 != lVar7; lVar7 = lVar7 + 1) {
        loS[lVar7] = loA[lVar7];
      }
      lVar8 = pnga_patch_intersect(local_478,local_470[0],loA,hiA,ndim);
    } while (lVar8 == 0);
    lVar7 = 0;
    do {
      lVar14 = lVar3;
      lVar12 = lVar3;
      icode = type;
      if (lVar10 == lVar7) goto LAB_001208ea;
      plVar2 = loS + lVar7;
      plVar1 = loA + lVar7;
      lVar7 = lVar7 + 1;
    } while (*plVar1 <= *plVar2);
    lVar10 = IVar15 + -1;
    if (lVar10 < 1) {
      lVar10 = 0;
    }
    lVar9 = 0;
    lVar7 = lVar3;
    for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
      lVar9 = lVar9 + (loA[lVar11] - loS[lVar11]) * lVar7;
      lVar7 = lVar7 * ld[lVar11];
    }
    if (0xf < type - 0x3e9U) {
switchD_00120847_caseD_3ed:
      pnga_error(" wrong data type ",type);
      IVar15 = ndim;
      icode = type;
      goto LAB_001208ea;
    }
    lVar9 = ((&uStack_550)[IVar15] - loS[IVar15 + -1]) * lVar7 + lVar9;
    switch(type) {
    case 0x3e9:
      src_data_ptr = src_data_ptr + lVar9 * 4;
      icode = 0x3e9;
      break;
    case 0x3ea:
      src_data_ptr = src_data_ptr + lVar9 * 8;
      icode = 0x3ea;
      break;
    case 0x3eb:
      src_data_ptr = src_data_ptr + lVar9 * 4;
      icode = 0x3eb;
      break;
    case 0x3ec:
      src_data_ptr = src_data_ptr + lVar9 * 8;
      icode = 0x3ec;
      break;
    default:
      goto switchD_00120847_caseD_3ed;
    case 0x3ee:
      lVar9 = lVar9 * 8;
      goto LAB_001208d7;
    case 0x3ef:
      lVar9 = lVar9 * 0x10;
LAB_001208d7:
      src_data_ptr = src_data_ptr + lVar9;
      break;
    case 0x3f8:
      src_data_ptr = src_data_ptr + lVar9 * 8;
      icode = 0x3f8;
    }
LAB_001208ea:
    for (; lVar14 < IVar15; lVar14 = lVar14 + 1) {
      plVar1 = hiA + lVar14;
      plVar2 = loA + lVar14;
      lVar12 = lVar12 * ((*plVar1 - *plVar2) + 1);
    }
    local_4b8[0] = 0;
    local_4b8[1] = 0;
    bunit[0] = 1;
    bunit[1] = 1;
    local_470[1] = (Integer *)ld[0];
    local_470[2] = (Integer *)(ld[0] * ld[1]);
    for (lVar10 = 2; lVar10 < IVar15; lVar10 = lVar10 + 1) {
      local_4b8[lVar10] = 0;
      bunit[lVar10] = ((hiA[lVar10 + -1] - (&uStack_550)[lVar10]) + 1) * bunit[lVar10 + -1];
      local_470[lVar10 + 1] = (Integer *)(ld[lVar10] * (long)local_470[lVar10]);
    }
    switch(icode) {
    case 0x3e9:
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      lVar10 = 0;
      while (lVar10 != lVar12) {
        lVar10 = lVar10 + 1;
        lVar14 = 0;
        for (lVar7 = lVar3; lVar7 < IVar15; lVar7 = lVar7 + 1) {
          lVar14 = lVar14 + (long)local_470[lVar7] * local_4b8[lVar7];
          lVar11 = local_4b8[lVar7] + (ulong)(lVar10 % bunit[lVar7] == 0);
          lVar9 = 0;
          if (lVar11 <= hiA[lVar7] - loA[lVar7]) {
            lVar9 = lVar11;
          }
          local_4b8[lVar7] = lVar9;
        }
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          *(int *)(src_data_ptr + lVar7 * 4 + lVar14 * 4) =
               *(int *)(src_data_ptr + lVar7 * 4 + lVar14 * 4) * *alpha;
        }
      }
      break;
    case 0x3ea:
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      lVar10 = 0;
      while (lVar10 != lVar12) {
        lVar10 = lVar10 + 1;
        lVar14 = 0;
        for (lVar7 = lVar3; lVar7 < IVar15; lVar7 = lVar7 + 1) {
          lVar14 = lVar14 + (long)local_470[lVar7] * local_4b8[lVar7];
          lVar11 = local_4b8[lVar7] + (ulong)(lVar10 % bunit[lVar7] == 0);
          lVar9 = 0;
          if (lVar11 <= hiA[lVar7] - loA[lVar7]) {
            lVar9 = lVar11;
          }
          local_4b8[lVar7] = lVar9;
        }
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          *(long *)(src_data_ptr + lVar7 * 8 + lVar14 * 8) =
               *(long *)(src_data_ptr + lVar7 * 8 + lVar14 * 8) * *alpha;
        }
      }
      break;
    case 0x3eb:
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      lVar10 = 0;
      while (lVar10 != lVar12) {
        lVar10 = lVar10 + 1;
        lVar14 = 0;
        for (lVar7 = lVar3; lVar7 < IVar15; lVar7 = lVar7 + 1) {
          lVar14 = lVar14 + (long)local_470[lVar7] * local_4b8[lVar7];
          lVar11 = local_4b8[lVar7] + (ulong)(lVar10 % bunit[lVar7] == 0);
          lVar9 = 0;
          if (lVar11 <= hiA[lVar7] - loA[lVar7]) {
            lVar9 = lVar11;
          }
          local_4b8[lVar7] = lVar9;
        }
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          *(float *)(src_data_ptr + lVar7 * 4 + lVar14 * 4) =
               *alpha * *(float *)(src_data_ptr + lVar7 * 4 + lVar14 * 4);
        }
      }
      break;
    case 0x3ec:
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      lVar10 = 0;
      while (lVar10 != lVar12) {
        lVar10 = lVar10 + 1;
        lVar14 = 0;
        for (lVar7 = lVar3; lVar7 < IVar15; lVar7 = lVar7 + 1) {
          lVar14 = lVar14 + (long)local_470[lVar7] * local_4b8[lVar7];
          lVar11 = local_4b8[lVar7] + (ulong)(lVar10 % bunit[lVar7] == 0);
          lVar9 = 0;
          if (lVar11 <= hiA[lVar7] - loA[lVar7]) {
            lVar9 = lVar11;
          }
          local_4b8[lVar7] = lVar9;
        }
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          *(double *)(src_data_ptr + lVar7 * 8 + lVar14 * 8) =
               *alpha * *(double *)(src_data_ptr + lVar7 * 8 + lVar14 * 8);
        }
      }
      break;
    default:
      pnga_error(" wrong data type ",icode);
      break;
    case 0x3ee:
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      lVar10 = 0;
      while (lVar10 != lVar12) {
        lVar10 = lVar10 + 1;
        lVar14 = 0;
        for (lVar7 = lVar3; lVar7 < IVar15; lVar7 = lVar7 + 1) {
          lVar14 = lVar14 + (long)local_470[lVar7] * local_4b8[lVar7];
          lVar11 = local_4b8[lVar7] + (ulong)(lVar10 % bunit[lVar7] == 0);
          lVar9 = 0;
          if (lVar11 <= hiA[lVar7] - loA[lVar7]) {
            lVar9 = lVar11;
          }
          local_4b8[lVar7] = lVar9;
        }
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          fVar17 = (float)*alpha;
          fVar18 = (float)((ulong)*alpha >> 0x20);
          *(ulong *)(src_data_ptr + lVar7 * 8 + lVar14 * 8) =
               CONCAT44(*(float *)(src_data_ptr + lVar7 * 8 + lVar14 * 8) * fVar18 +
                        fVar17 * *(float *)(src_data_ptr + lVar7 * 8 + lVar14 * 8 + 4),
                        *(float *)(src_data_ptr + lVar7 * 8 + lVar14 * 8) * fVar17 +
                        fVar18 * -*(float *)(src_data_ptr + lVar7 * 8 + lVar14 * 8 + 4));
        }
      }
      break;
    case 0x3ef:
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      lVar10 = 0;
      while (lVar10 != lVar12) {
        lVar10 = lVar10 + 1;
        lVar14 = 0;
        for (lVar7 = lVar3; lVar7 < IVar15; lVar7 = lVar7 + 1) {
          lVar14 = lVar14 + (long)local_470[lVar7] * local_4b8[lVar7];
          lVar11 = local_4b8[lVar7] + (ulong)(lVar10 % bunit[lVar7] == 0);
          lVar9 = 0;
          if (lVar11 <= hiA[lVar7] - loA[lVar7]) {
            lVar9 = lVar11;
          }
          local_4b8[lVar7] = lVar9;
        }
        pauVar13 = (undefined1 (*) [16])(src_data_ptr + lVar14 * 0x10);
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          dVar5 = *(double *)*pauVar13 * *(double *)((long)alpha + 8) +
                  *alpha * *(double *)(*pauVar13 + 8);
          auVar4._8_4_ = SUB84(dVar5,0);
          auVar4._0_8_ = *(double *)*pauVar13 * *alpha +
                         *(double *)((long)alpha + 8) * -*(double *)(*pauVar13 + 8);
          auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
          *pauVar13 = auVar4;
          pauVar13 = pauVar13 + 1;
        }
      }
      break;
    case 0x3f8:
      if (lVar12 < 1) {
        lVar12 = 0;
      }
      lVar10 = 0;
      while (lVar10 != lVar12) {
        lVar10 = lVar10 + 1;
        lVar14 = 0;
        for (lVar7 = lVar3; lVar7 < IVar15; lVar7 = lVar7 + 1) {
          lVar14 = lVar14 + (long)local_470[lVar7] * local_4b8[lVar7];
          lVar11 = local_4b8[lVar7] + (ulong)(lVar10 % bunit[lVar7] == 0);
          lVar9 = 0;
          if (lVar11 <= hiA[lVar7] - loA[lVar7]) {
            lVar9 = lVar11;
          }
          local_4b8[lVar7] = lVar9;
        }
        for (lVar7 = 0; lVar7 <= hiA[0] - loA[0]; lVar7 = lVar7 + 1) {
          *(long *)(src_data_ptr + lVar7 * 8 + lVar14 * 8) =
               *(long *)(src_data_ptr + lVar7 * 8 + lVar14 * 8) * *alpha;
        }
      }
    }
  } while( true );
}

Assistant:

void pnga_scale_patch(Integer g_a, Integer *lo, Integer *hi, void *alpha)
{
  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM];
  Integer ld[MAXDIM];
  char *src_data_ptr;
  Integer num_blocks, nproc;
  Integer me= pnga_nodeid();
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&src_data_ptr,ld)) {
    Integer offset, j, jtmp, chk;
    Integer loS[MAXDIM];
    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            src_data_ptr = (void*)((int*)src_data_ptr + offset);
            break;
          case C_DCPL:
            src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
            break;
          case C_SCPL:
            src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
            break;
          case C_DBL:
            src_data_ptr = (void*)((double*)src_data_ptr + offset);
            break;
          case C_FLOAT:
            src_data_ptr = (void*)((float*)src_data_ptr + offset);
            break;     
          case C_LONG:
            src_data_ptr = (void*)((long*)src_data_ptr + offset);
            break;                          
          case C_LONGLONG:
            src_data_ptr = (void*)((long long*)src_data_ptr + offset);
            break;                          
          default: pnga_error(" wrong data type ",type);
        }
      }

      /* set all values in patch to *val */
      snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);
    }

  }
#else
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, loA, hiA);

    /* determine subset of my patch to access */
    if (pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      pnga_access_ptr(g_a, loA, hiA, &src_data_ptr, ld);

      snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA); 
    }
  } else {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {
        /* get limits of VISIBLE patch */
        pnga_distribution(g_a, i, loA, hiA);

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get src_data_ptr to corner of patch */
          /* ld are leading dimensions INCLUDING ghost cells */
          pnga_access_block_ptr(g_a, i, &src_data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                src_data_ptr = (void*)((int*)src_data_ptr + offset);
                break;
              case C_DCPL:
                src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
                break;
              case C_SCPL:
                src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
                break;
              case C_DBL:
                src_data_ptr = (void*)((double*)src_data_ptr + offset);
                break;
              case C_FLOAT:
                src_data_ptr = (void*)((float*)src_data_ptr + offset);
                break;     
              case C_LONG:
                src_data_ptr = (void*)((long*)src_data_ptr + offset);
                break;                          
              case C_LONGLONG:
                src_data_ptr = (void*)((long long*)src_data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &src_data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                src_data_ptr = (void*)((int*)src_data_ptr + offset);
                break;
              case C_DCPL:
                src_data_ptr = (void*)((double*)src_data_ptr + 2*offset);
                break;
              case C_SCPL:
                src_data_ptr = (void*)((float*)src_data_ptr + 2*offset);
                break;
              case C_DBL:
                src_data_ptr = (void*)((double*)src_data_ptr + offset);
                break;
              case C_FLOAT:
                src_data_ptr = (void*)((float*)src_data_ptr + offset);
                break;     
              case C_LONG:
                src_data_ptr = (void*)((long*)src_data_ptr + offset);
                break;                          
              case C_LONGLONG:
                src_data_ptr = (void*)((long long*)src_data_ptr + offset);
                break;                          
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* set all values in patch to *val */
          snga_scale_patch_value(type, ndim, loA, hiA, ld, src_data_ptr, alpha);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();   
}